

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O0

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this,
          MatrixType *matrix)

{
  Index nnz_00;
  undefined1 auVar1 [16];
  Index IVar2;
  Index IVar3;
  bool bVar4;
  Index IVar5;
  Index IVar6;
  Index IVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Index *pIVar11;
  DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *pDVar12;
  Scalar *pSVar13;
  DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  int *piVar14;
  IndicesType *pIVar15;
  IndicesType *iperm_c_00;
  Scalar *pSVar16;
  Scalar *outerIndexPtr_00;
  Scalar *innerIndexPtr;
  Scalar *valuePtr;
  BlockIndexVector local_470;
  string local_458 [32];
  ostringstream local_438 [8];
  ostringstream returnInfo;
  BlockScalarVector local_2c0;
  BlockIndexVector local_2a8;
  BlockIndexVector local_290;
  BlockIndexVector local_278;
  BlockScalarVector local_260;
  undefined1 local_248 [8];
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> segrep_k;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_k;
  BlockIndexVector local_1f0;
  BlockIndexVector local_1d8;
  undefined1 local_1c0 [8];
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> repfnz_k;
  VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> panel_lsubk;
  int local_168;
  int local_164;
  Index panel_size;
  Index jj;
  Index k;
  Index i;
  Index irep;
  Index nseg;
  Index nseg1;
  Index pivrow;
  IndexVector panel_histo;
  Index jcol;
  Scalar local_12c;
  undefined1 local_128 [8];
  IndexVector relax_end;
  undefined1 local_110 [8];
  PermutationType iperm_c;
  ScalarVector tempv;
  ScalarVector dense;
  undefined1 local_d8 [8];
  IndexVector marker;
  IndexVector xprune;
  IndexVector panel_lsub;
  IndexVector repfnz;
  IndexVector xplore;
  IndexVector parent;
  undefined1 local_68 [8];
  IndexVector segrep;
  Index info;
  Index lwork;
  Index maxpanel;
  Index nnz;
  Index n;
  Index m;
  Index i_3;
  Index i_2;
  Index i_1;
  Index *outerIndexPtr_t;
  Index *outerIndexPtr;
  MatrixType *matrix_local;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_local;
  
  outerIndexPtr = (Index *)matrix;
  matrix_local = (MatrixType *)this;
  if ((this->m_analysisIsOk & 1U) == 0) {
    __assert_fail("m_analysisIsOk && \"analyzePattern() should be called first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c8,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  IVar5 = SparseMatrix<double,_0,_int>::rows(matrix);
  IVar6 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)outerIndexPtr);
  if (IVar5 != IVar6) {
    __assert_fail("(matrix.rows() == matrix.cols()) && \"Only for squared matrices\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0x1c9,
                  "void Eigen::SparseLU<Eigen::SparseMatrix<double>>::factorize(const MatrixType &) [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
                 );
  }
  SparseMatrix<double,_0,_int>::operator=
            (&this->m_mat,(SparseMatrix<double,_0,_int> *)outerIndexPtr);
  IVar7 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                    ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)&this->m_perm_c);
  if (IVar7 == 0) {
    IVar5 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)outerIndexPtr);
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::resize
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)&this->m_perm_c,IVar5);
    for (n = 0; IVar2 = n,
        IVar5 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)outerIndexPtr),
        IVar3 = n, IVar2 < IVar5; n = n + 1) {
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_c);
      pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar12,(long)n)
      ;
      *pSVar13 = IVar3;
    }
  }
  else {
    SparseMatrix<double,_0,_int>::uncompress(&this->m_mat);
    bVar4 = SparseMatrix<double,_0,_int>::isCompressed
                      ((SparseMatrix<double,_0,_int> *)outerIndexPtr);
    if (bVar4) {
      outerIndexPtr_t =
           SparseMatrix<double,_0,_int>::outerIndexPtr
                     ((SparseMatrix<double,_0,_int> *)outerIndexPtr);
    }
    else {
      IVar5 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)outerIndexPtr);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(IVar5 + 1);
      uVar10 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      _i_2 = (Index *)operator_new__(uVar10);
      for (i_3 = 0; IVar2 = i_3,
          IVar5 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)outerIndexPtr),
          IVar2 <= IVar5; i_3 = i_3 + 1) {
        pIVar11 = SparseMatrix<double,_0,_int>::outerIndexPtr(&this->m_mat);
        _i_2[i_3] = pIVar11[i_3];
      }
      outerIndexPtr_t = _i_2;
    }
    for (m = 0; IVar2 = m,
        IVar5 = SparseMatrix<double,_0,_int>::cols((SparseMatrix<double,_0,_int> *)outerIndexPtr),
        IVar2 < IVar5; m = m + 1) {
      IVar5 = outerIndexPtr_t[m];
      pIVar11 = SparseMatrix<double,_0,_int>::outerIndexPtr(&this->m_mat);
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_c);
      pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar12,(long)m)
      ;
      pIVar11[*pSVar13] = IVar5;
      iVar8 = outerIndexPtr_t[m + 1];
      iVar9 = outerIndexPtr_t[m];
      pIVar11 = SparseMatrix<double,_0,_int>::innerNonZeroPtr(&this->m_mat);
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_c);
      pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar12,(long)m)
      ;
      pIVar11[*pSVar13] = iVar8 - iVar9;
    }
    bVar4 = SparseMatrix<double,_0,_int>::isCompressed
                      ((SparseMatrix<double,_0,_int> *)outerIndexPtr);
    if ((!bVar4) && (outerIndexPtr_t != (Index *)0x0)) {
      operator_delete__(outerIndexPtr_t);
    }
  }
  nnz = SparseMatrix<double,_0,_int>::rows(&this->m_mat);
  maxpanel = SparseMatrix<double,_0,_int>::cols(&this->m_mat);
  IVar5 = SparseMatrix<double,_0,_int>::nonZeros(&this->m_mat);
  iVar8 = (this->m_perfv).panel_size * nnz;
  segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       internal::SparseLUImpl<double,_int>::memInit
                 ((SparseLUImpl<double,_int> *)this,nnz,maxpanel,IVar5,0,(this->m_perfv).fillfactor,
                  (this->m_perfv).panel_size,&this->m_glu);
  if (segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ == 0
     ) {
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_68,(long)nnz);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_68);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)nnz);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)nnz);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(long)iVar8);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)iVar8);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (long)maxpanel);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_d8,(long)(nnz * 3));
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_d8);
    dense.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         0xffffffff;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(Scalar *)
                       ((long)&dense.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows + 4));
    dense.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
         0xffffffff;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
               &xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Scalar *)
               &dense.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(long)iVar8);
    Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &iperm_c.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    iVar8 = internal::LUnumTempV<int>
                      (&nnz,&(this->m_perfv).panel_size,&(this->m_perfv).maxsuper,&nnz);
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &iperm_c.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,(long)iVar8);
    relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (DenseIndex)
         PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::inverse
                   ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)&this->m_perm_c);
    PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
              ((PermutationMatrix<_1,_1,int> *)local_110,
               (Transpose<Eigen::PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_>_> *)
               &relax_end.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_128,(long)maxpanel);
    if ((this->m_symmetricmode & 1U) == 1) {
      internal::SparseLUImpl<double,_int>::heap_relax_snode
                ((SparseLUImpl<double,_int> *)this,maxpanel,&this->m_etree,(this->m_perfv).relax,
                 (IndexVector *)local_d8,(IndexVector *)local_128);
    }
    else {
      internal::SparseLUImpl<double,_int>::relax_snode
                ((SparseLUImpl<double,_int> *)this,maxpanel,&this->m_etree,(this->m_perfv).relax,
                 (IndexVector *)local_d8,(IndexVector *)local_128);
    }
    PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::resize
              ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)&this->m_perm_r,nnz);
    this_00 = (DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
              PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
    local_12c = -1;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant(this_00,&local_12c);
    jcol = -1;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_d8,&jcol);
    this->m_detPermR = 1;
    pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                         &(this->m_glu).supno,0);
    *pSVar13 = -1;
    panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         0;
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&this->m_glu,
               (Scalar *)
               ((long)&panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 4));
    pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                         &(this->m_glu).xlusup,0);
    *pSVar13 = 0;
    pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                         &(this->m_glu).xusub,0);
    *pSVar13 = 0;
    pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                         &(this->m_glu).xlsub,0);
    *pSVar13 = 0;
    pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&this->m_glu,0);
    *pSVar13 = 0;
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&nseg1,(long)maxpanel);
    for (panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
         _0_4_ = 0;
        (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows < maxpanel;
        panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
        _0_4_ = local_168 +
                (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows) {
      local_168 = (this->m_perfv).panel_size;
      panel_size = (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows;
      do {
        panel_size = panel_size + 1;
        panel_lsubk.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
        super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride
        ._4_4_ = (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows + local_168;
        piVar14 = std::min<int>((int *)((long)&panel_lsubk.
                                               super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>
                                               .
                                               super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                                               .
                                               super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                                               .m_outerStride + 4),&maxpanel);
        if (*piVar14 <= panel_size) goto LAB_00272b5d;
        pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_128,
                             (long)panel_size);
      } while (*pSVar13 == -1);
      local_168 = panel_size -
                  (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
LAB_00272b5d:
      IVar2 = nnz;
      iVar8 = (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows;
      if (panel_size == maxpanel) {
        local_168 = maxpanel -
                    (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
      }
      pIVar15 = PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
      internal::SparseLUImpl<double,_int>::panel_dfs
                ((SparseLUImpl<double,_int> *)this,IVar2,local_168,iVar8,&this->m_mat,pIVar15,&irep,
                 (ScalarVector *)
                 &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)
                         &xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,(IndexVector *)local_68,
                 (IndexVector *)
                 &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)
                         &marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,(IndexVector *)local_d8,
                 (IndexVector *)
                 &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(IndexVector *)
                         &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,&this->m_glu);
      internal::SparseLUImpl<double,_int>::panel_bmod
                ((SparseLUImpl<double,_int> *)this,nnz,local_168,
                 (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,irep,
                 (ScalarVector *)
                 &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(ScalarVector *)
                         &iperm_c.m_indices.
                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows,(IndexVector *)local_68,
                 (IndexVector *)
                 &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,&this->m_glu);
      for (local_164 = (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows;
          local_164 <
          (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows + local_168; local_164 = local_164 + 1) {
        iVar9 = (local_164 -
                (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows) * nnz;
        i = irep;
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)
                   &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride,
                   (Matrix<int,__1,_1,_0,__1,_1> *)
                   &xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,(long)iVar9,(long)nnz);
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_1c0,
                   (Matrix<int,__1,_1,_0,__1,_1> *)
                   &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows,(long)iVar9,(long)nnz);
        IVar2 = nnz;
        pIVar15 = PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
        iVar8 = (this->m_perfv).maxsuper;
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_1d8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   &repfnz_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride);
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_1f0,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_1c0);
        segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             internal::SparseLUImpl<double,_int>::column_dfs
                       ((SparseLUImpl<double,_int> *)this,IVar2,local_164,pIVar15,iVar8,&i,
                        &local_1d8,(IndexVector *)local_68,&local_1f0,
                        (IndexVector *)
                        &marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,(IndexVector *)local_d8,
                        (IndexVector *)
                        &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,
                        (IndexVector *)
                        &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows,&this->m_glu);
        if (segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _4_4_ != 0) {
          std::__cxx11::string::operator=
                    ((string *)&this->m_lastError,"UNABLE TO EXPAND MEMORY IN COLUMN_DFS() ");
          this->m_info = NumericalIssue;
          this->m_factorizationIsOk = false;
          goto LAB_00273536;
        }
        VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)
                   &segrep_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                    super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                    m_outerStride,
                   (Matrix<double,__1,_1,_0,__1,_1> *)
                   &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,(long)iVar9,(long)nnz);
        VectorBlock<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1> *)local_248,
                   (Matrix<int,__1,_1,_0,__1,_1> *)local_68,(long)irep,(long)(nnz - irep));
        iVar8 = i - irep;
        Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_260,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                   )&segrep_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .m_outerStride);
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_278,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_248);
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_290,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_1c0);
        segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             internal::SparseLUImpl<double,_int>::column_bmod
                       ((SparseLUImpl<double,_int> *)this,local_164,iVar8,&local_260,
                        (ScalarVector *)
                        &iperm_c.m_indices.
                         super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows,&local_278,&local_290,
                        (int)panel_histo.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                             .m_storage.m_rows,&this->m_glu);
        IVar2 = i;
        if (segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _4_4_ != 0) {
          std::__cxx11::string::operator=
                    ((string *)&this->m_lastError,"UNABLE TO EXPAND MEMORY IN COLUMN_BMOD() ");
          this->m_info = NumericalIssue;
          this->m_factorizationIsOk = false;
          goto LAB_00273536;
        }
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_2a8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_1c0);
        pIVar15 = PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
        Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_2c0,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                   )&segrep_k.super_Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .super_BlockImpl_dense<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .m_outerStride);
        segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             internal::SparseLUImpl<double,_int>::copy_to_ucol
                       ((SparseLUImpl<double,_int> *)this,local_164,IVar2,(IndexVector *)local_68,
                        &local_2a8,pIVar15,&local_2c0,&this->m_glu);
        if (segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _4_4_ != 0) {
          std::__cxx11::string::operator=
                    ((string *)&this->m_lastError,"UNABLE TO EXPAND MEMORY IN COPY_TO_UCOL() ");
          this->m_info = NumericalIssue;
          this->m_factorizationIsOk = false;
          goto LAB_00273536;
        }
        pIVar15 = PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
        iperm_c_00 = PermutationMatrix<-1,_-1,_int>::indices
                               ((PermutationMatrix<_1,__1,_int> *)local_110);
        segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             internal::SparseLUImpl<double,_int>::pivotL
                       ((SparseLUImpl<double,_int> *)this,local_164,&this->m_diagpivotthresh,pIVar15
                        ,iperm_c_00,&nseg,&this->m_glu);
        if (segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
            _4_4_ != 0) {
          std::__cxx11::string::operator=
                    ((string *)&this->m_lastError,
                     "THE MATRIX IS STRUCTURALLY SINGULAR ... ZERO COLUMN AT ");
          std::__cxx11::ostringstream::ostringstream(local_438);
          std::ostream::operator<<
                    (local_438,
                     segrep.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows._4_4_);
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator+=((string *)&this->m_lastError,local_458);
          std::__cxx11::string::~string(local_458);
          this->m_info = NumericalIssue;
          this->m_factorizationIsOk = false;
          std::__cxx11::ostringstream::~ostringstream(local_438);
          goto LAB_00273536;
        }
        if (nseg != local_164) {
          this->m_detPermR = -this->m_detPermR;
        }
        pIVar15 = PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
        IVar3 = nseg;
        IVar2 = i;
        Ref<Eigen::Matrix<int,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
        Ref<Eigen::Block<Eigen::Matrix<int,_1,1,0,_1,1>,_1,1,false>>
                  ((Ref<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_470,
                   (DenseBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                   local_1c0);
        internal::SparseLUImpl<double,_int>::pruneL
                  ((SparseLUImpl<double,_int> *)this,local_164,pIVar15,IVar3,IVar2,
                   (IndexVector *)local_68,&local_470,
                   (IndexVector *)
                   &marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,&this->m_glu);
        for (jj = 0; jj < i; jj = jj + 1) {
          pSVar13 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_68,
                               (long)jj);
          pSVar16 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                                  *)local_1c0,(long)*pSVar13);
          *pSVar16 = -1;
        }
      }
    }
    internal::SparseLUImpl<double,_int>::countnz
              ((SparseLUImpl<double,_int> *)this,maxpanel,&this->m_nnzL,&this->m_nnzU,&this->m_glu);
    IVar2 = maxpanel;
    pIVar15 = PermutationMatrix<-1,_-1,_int>::indices(&this->m_perm_r);
    internal::SparseLUImpl<double,_int>::fixupL
              ((SparseLUImpl<double,_int> *)this,IVar2,pIVar15,&this->m_glu);
    internal::MappedSuperNodalMatrix<double,_int>::setInfos
              (&this->m_Lstore,nnz,maxpanel,&(this->m_glu).lusup,&(this->m_glu).xlusup,
               &(this->m_glu).lsub,&(this->m_glu).xlsub,&(this->m_glu).supno,&(this->m_glu).xsup);
    IVar3 = nnz;
    IVar2 = maxpanel;
    nnz_00 = this->m_nnzU;
    outerIndexPtr_00 =
         PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::data
                   (&(this->m_glu).xusub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                   );
    innerIndexPtr =
         PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::data
                   (&(this->m_glu).usub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>)
    ;
    valuePtr = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                         (&(this->m_glu).ucol.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
    MappedSparseMatrix<double,_0,_int>::MappedSparseMatrix
              (&this->m_Ustore,IVar3,IVar2,nnz_00,outerIndexPtr_00,innerIndexPtr,valuePtr);
    this->m_info = Success;
    this->m_factorizationIsOk = true;
LAB_00273536:
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&nseg1);
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_128);
    PermutationMatrix<-1,_-1,_int>::~PermutationMatrix((PermutationMatrix<_1,__1,_int> *)local_110);
    Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &iperm_c.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &tempv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_d8);
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &marker.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &xprune.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &panel_lsub.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &repfnz.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)
               &xplore.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_68);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->m_lastError,"UNABLE TO ALLOCATE WORKING MEMORY\n\n");
    this->m_factorizationIsOk = false;
  }
  return;
}

Assistant:

void SparseLU<MatrixType, OrderingType>::factorize(const MatrixType& matrix)
{
  using internal::emptyIdxLU;
  eigen_assert(m_analysisIsOk && "analyzePattern() should be called first"); 
  eigen_assert((matrix.rows() == matrix.cols()) && "Only for squared matrices");
  
  typedef typename IndexVector::Scalar Index; 
  
  
  // Apply the column permutation computed in analyzepattern()
  //   m_mat = matrix * m_perm_c.inverse(); 
  m_mat = matrix;
  if (m_perm_c.size()) 
  {
    m_mat.uncompress(); //NOTE: The effect of this command is only to create the InnerNonzeros pointers.
    //Then, permute only the column pointers
    const Index * outerIndexPtr;
    if (matrix.isCompressed()) outerIndexPtr = matrix.outerIndexPtr();
    else
    {
      Index* outerIndexPtr_t = new Index[matrix.cols()+1];
      for(Index i = 0; i <= matrix.cols(); i++) outerIndexPtr_t[i] = m_mat.outerIndexPtr()[i];
      outerIndexPtr = outerIndexPtr_t;
    }
    for (Index i = 0; i < matrix.cols(); i++)
    {
      m_mat.outerIndexPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i];
      m_mat.innerNonZeroPtr()[m_perm_c.indices()(i)] = outerIndexPtr[i+1] - outerIndexPtr[i];
    }
    if(!matrix.isCompressed()) delete[] outerIndexPtr;
  } 
  else 
  { //FIXME This should not be needed if the empty permutation is handled transparently
    m_perm_c.resize(matrix.cols());
    for(Index i = 0; i < matrix.cols(); ++i) m_perm_c.indices()(i) = i;
  }
  
  Index m = m_mat.rows();
  Index n = m_mat.cols();
  Index nnz = m_mat.nonZeros();
  Index maxpanel = m_perfv.panel_size * m;
  // Allocate working storage common to the factor routines
  Index lwork = 0;
  Index info = Base::memInit(m, n, nnz, lwork, m_perfv.fillfactor, m_perfv.panel_size, m_glu); 
  if (info) 
  {
    m_lastError = "UNABLE TO ALLOCATE WORKING MEMORY\n\n" ;
    m_factorizationIsOk = false;
    return ; 
  }
  
  // Set up pointers for integer working arrays 
  IndexVector segrep(m); segrep.setZero();
  IndexVector parent(m); parent.setZero();
  IndexVector xplore(m); xplore.setZero();
  IndexVector repfnz(maxpanel);
  IndexVector panel_lsub(maxpanel);
  IndexVector xprune(n); xprune.setZero();
  IndexVector marker(m*internal::LUNoMarker); marker.setZero();
  
  repfnz.setConstant(-1); 
  panel_lsub.setConstant(-1);
  
  // Set up pointers for scalar working arrays 
  ScalarVector dense; 
  dense.setZero(maxpanel);
  ScalarVector tempv; 
  tempv.setZero(internal::LUnumTempV(m, m_perfv.panel_size, m_perfv.maxsuper, /*m_perfv.rowblk*/m) );
  
  // Compute the inverse of perm_c
  PermutationType iperm_c(m_perm_c.inverse()); 
  
  // Identify initial relaxed snodes
  IndexVector relax_end(n);
  if ( m_symmetricmode == true ) 
    Base::heap_relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  else
    Base::relax_snode(n, m_etree, m_perfv.relax, marker, relax_end);
  
  
  m_perm_r.resize(m); 
  m_perm_r.indices().setConstant(-1);
  marker.setConstant(-1);
  m_detPermR = 1; // Record the determinant of the row permutation
  
  m_glu.supno(0) = emptyIdxLU; m_glu.xsup.setConstant(0);
  m_glu.xsup(0) = m_glu.xlsub(0) = m_glu.xusub(0) = m_glu.xlusup(0) = Index(0);
  
  // Work on one 'panel' at a time. A panel is one of the following :
  //  (a) a relaxed supernode at the bottom of the etree, or
  //  (b) panel_size contiguous columns, <panel_size> defined by the user
  Index jcol; 
  IndexVector panel_histo(n);
  Index pivrow; // Pivotal row number in the original row matrix
  Index nseg1; // Number of segments in U-column above panel row jcol
  Index nseg; // Number of segments in each U-column 
  Index irep; 
  Index i, k, jj; 
  for (jcol = 0; jcol < n; )
  {
    // Adjust panel size so that a panel won't overlap with the next relaxed snode. 
    Index panel_size = m_perfv.panel_size; // upper bound on panel width
    for (k = jcol + 1; k < (std::min)(jcol+panel_size, n); k++)
    {
      if (relax_end(k) != emptyIdxLU) 
      {
        panel_size = k - jcol; 
        break; 
      }
    }
    if (k == n) 
      panel_size = n - jcol; 
      
    // Symbolic outer factorization on a panel of columns 
    Base::panel_dfs(m, panel_size, jcol, m_mat, m_perm_r.indices(), nseg1, dense, panel_lsub, segrep, repfnz, xprune, marker, parent, xplore, m_glu); 
    
    // Numeric sup-panel updates in topological order 
    Base::panel_bmod(m, panel_size, jcol, nseg1, dense, tempv, segrep, repfnz, m_glu); 
    
    // Sparse LU within the panel, and below the panel diagonal 
    for ( jj = jcol; jj< jcol + panel_size; jj++) 
    {
      k = (jj - jcol) * m; // Column index for w-wide arrays 
      
      nseg = nseg1; // begin after all the panel segments
      //Depth-first-search for the current column
      VectorBlock<IndexVector> panel_lsubk(panel_lsub, k, m);
      VectorBlock<IndexVector> repfnz_k(repfnz, k, m); 
      info = Base::column_dfs(m, jj, m_perm_r.indices(), m_perfv.maxsuper, nseg, panel_lsubk, segrep, repfnz_k, xprune, marker, parent, xplore, m_glu); 
      if ( info ) 
      {
        m_lastError =  "UNABLE TO EXPAND MEMORY IN COLUMN_DFS() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      // Numeric updates to this column 
      VectorBlock<ScalarVector> dense_k(dense, k, m); 
      VectorBlock<IndexVector> segrep_k(segrep, nseg1, m-nseg1); 
      info = Base::column_bmod(jj, (nseg - nseg1), dense_k, tempv, segrep_k, repfnz_k, jcol, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COLUMN_BMOD() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Copy the U-segments to ucol(*)
      info = Base::copy_to_ucol(jj, nseg, segrep, repfnz_k ,m_perm_r.indices(), dense_k, m_glu); 
      if ( info ) 
      {
        m_lastError = "UNABLE TO EXPAND MEMORY IN COPY_TO_UCOL() ";
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Form the L-segment 
      info = Base::pivotL(jj, m_diagpivotthresh, m_perm_r.indices(), iperm_c.indices(), pivrow, m_glu);
      if ( info ) 
      {
        m_lastError = "THE MATRIX IS STRUCTURALLY SINGULAR ... ZERO COLUMN AT ";
        std::ostringstream returnInfo;
        returnInfo << info; 
        m_lastError += returnInfo.str();
        m_info = NumericalIssue; 
        m_factorizationIsOk = false; 
        return; 
      }
      
      // Update the determinant of the row permutation matrix
      if (pivrow != jj) m_detPermR *= -1;

      // Prune columns (0:jj-1) using column jj
      Base::pruneL(jj, m_perm_r.indices(), pivrow, nseg, segrep, repfnz_k, xprune, m_glu); 
      
      // Reset repfnz for this column 
      for (i = 0; i < nseg; i++)
      {
        irep = segrep(i); 
        repfnz_k(irep) = emptyIdxLU; 
      }
    } // end SparseLU within the panel  
    jcol += panel_size;  // Move to the next panel
  } // end for -- end elimination 
  
  // Count the number of nonzeros in factors 
  Base::countnz(n, m_nnzL, m_nnzU, m_glu); 
  // Apply permutation  to the L subscripts 
  Base::fixupL(n, m_perm_r.indices(), m_glu); 
  
  // Create supernode matrix L 
  m_Lstore.setInfos(m, n, m_glu.lusup, m_glu.xlusup, m_glu.lsub, m_glu.xlsub, m_glu.supno, m_glu.xsup); 
  // Create the column major upper sparse matrix  U; 
  new (&m_Ustore) MappedSparseMatrix<Scalar, ColMajor, Index> ( m, n, m_nnzU, m_glu.xusub.data(), m_glu.usub.data(), m_glu.ucol.data() ); 
  
  m_info = Success;
  m_factorizationIsOk = true;
}